

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zlk.cpp
# Opt level: O2

int __thiscall
pg::ZLKSolver::attractPar
          (ZLKSolver *this,WorkerP *__lace_worker,Task *__lace_dq_head,int i,int r,
          vector<int,_std::allocator<int>_> *R)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int *piVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  ostream *poVar8;
  int iVar9;
  ulong uVar10;
  size_type __n;
  int *piVar11;
  int k;
  long lVar12;
  bool bVar13;
  
  uVar1 = ((this->super_Solver).game)->_priority[i];
  uVar5 = lace_workers();
  lVar12 = pvec;
  uVar10 = (ulong)(~((int)uVar5 >> 0x1f) & uVar5);
  for (uVar7 = 0; uVar10 != uVar7; uVar7 = uVar7 + 1) {
    **(undefined4 **)(lVar12 + uVar7 * 8) = 0;
  }
  iVar9 = 0;
  piVar4 = *(int **)(lVar12 + (ulong)__lace_worker->worker * 8);
  uVar5 = uVar1 & 1;
  for (; -1 < i; i = i - 1) {
    piVar11 = this->region;
    uVar6 = piVar11[(uint)i];
    if (0x80000000 < uVar6) {
      uVar2 = ((this->super_Solver).game)->_priority[(uint)i];
      if (this->to_inversion == false) {
        if (uVar2 != uVar1) break;
      }
      else if ((uVar2 & 1) != uVar5) goto LAB_00148518;
      if (iVar9 == 0) {
        piVar11[(uint)i] = r;
LAB_001484b8:
        this->winning[(uint)i] = uVar5;
        this->strategy[(uint)i] = -1;
        iVar3 = *piVar4;
        *piVar4 = iVar3 + 1;
        piVar4[(long)iVar3 + 1] = i;
        attractParT_SPAWN(__lace_worker,__lace_dq_head,uVar5,i,r,this);
        __lace_dq_head = __lace_dq_head + 1;
        iVar9 = iVar9 + 1;
      }
      else {
        do {
          LOCK();
          bVar13 = uVar6 == piVar11[(uint)i];
          if (bVar13) {
            piVar11[(uint)i] = r;
          }
          UNLOCK();
          if (bVar13) {
            if (r != -0x7fffffff) goto LAB_001484b8;
            break;
          }
          piVar11 = this->region;
          uVar6 = piVar11[(uint)i];
        } while ((int)uVar6 < 0);
      }
    }
  }
LAB_0014852c:
  while( true ) {
    __lace_dq_head = __lace_dq_head + -1;
    bVar13 = iVar9 == 0;
    iVar9 = iVar9 + -1;
    if (bVar13) break;
    attractParT_SYNC(__lace_worker,__lace_dq_head);
  }
  __n = (long)(R->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
              _M_finish -
        (long)(R->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
              _M_start >> 2;
  for (uVar7 = 0; uVar10 != uVar7; uVar7 = uVar7 + 1) {
    __n = __n + (long)**(int **)(pvec + uVar7 * 8);
  }
  std::vector<int,_std::allocator<int>_>::reserve(R,__n);
  for (uVar7 = 0; uVar7 != uVar10; uVar7 = uVar7 + 1) {
    piVar4 = *(int **)(pvec + uVar7 * 8);
    piVar11 = piVar4;
    for (lVar12 = 0; piVar11 = piVar11 + 1, lVar12 < *piVar4; lVar12 = lVar12 + 1) {
      if (1 < (this->super_Solver).trace) {
        poVar8 = std::operator<<((this->super_Solver).logger,"attracted ");
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,*piVar11);
        poVar8 = std::operator<<(poVar8," (");
        poVar8 = (ostream *)
                 std::ostream::operator<<(poVar8,((this->super_Solver).game)->_priority[*piVar11]);
        poVar8 = std::operator<<(poVar8,")");
        std::endl<char,std::char_traits<char>>(poVar8);
      }
      std::vector<int,_std::allocator<int>_>::push_back(R,piVar11);
    }
    *piVar4 = 0;
  }
  return i;
LAB_00148518:
  while (bVar13 = iVar9 != 0, iVar9 = iVar9 + -1, bVar13) {
    __lace_dq_head = __lace_dq_head + -1;
    attractParT_SYNC(__lace_worker,__lace_dq_head);
  }
  iVar9 = 0;
  goto LAB_0014852c;
}

Assistant:

int
ZLKSolver::attractPar(WorkerP* __lace_worker, Task* __lace_dq_head, int i, int r, std::vector<int>* R)
{
    const int pr = priority(i);
    const int pl = pr & 1;

    // initialize pvec (set count to 0) for all workers
    const int W = lace_workers();
    for (int j=0; j<W; j++) pvec[j]->count = 0;

    par_helper* ours = pvec[LACE_WORKER_ID];
    int spawn_count = 0;

    for (; i>=0; i--) {
        int _r = region[i];
        if (_r == DIS or _r >= 0) continue; // not in subgame or attracted
        if (!to_inversion and priority(i) != pr) break;
        if ((priority(i)&1) != pl) { // search until parity inversion
            // first SYNC on all children, who knows this node may be attracted
            while (spawn_count) { SYNC(attractParT); spawn_count--; }
            // after SYNC, check if node <i> is now attracted.
            if (_r < 0) break; // not attracted, so we're done!
            else continue; // already done
        }

        // if c != 0, then we compete with attractParT and must use compare and swap
        if (spawn_count == 0) {
            region[i] = r; // just set, no competing threads
        } else {
            // competing threads! use compare and swap [in a loop]
            while (true) {
                if (__sync_bool_compare_and_swap(&region[i], _r, r)) {
                    _r = r;
                    break;
                }
                _r = *(volatile int*)&region[i];
                if (_r < 0) continue;
                _r = BOT;
                break;
            }
            if (_r == BOT) continue; // someone else claimed!
        }

        winning[i] = pl;
        strategy[i] = -1; // head nodes have no strategy (for now)
        ours->items[ours->count++] = i;
        SPAWN(attractParT, pl, i, r, this);
        spawn_count++;
    }

    // first SYNC on all children (if any)
    while (spawn_count) { SYNC(attractParT); spawn_count--; }

    // update R
    size_t to_reserve = R->size();
    for (int j=0; j<W; j++) to_reserve += pvec[j]->count;
    R->reserve(to_reserve);

    for (int j=0; j<W; j++) {
        par_helper* x = pvec[j];
        for (int k=0; k<x->count; k++) {
#ifndef NDEBUG
            if (trace >= 2) logger << "attracted " << x->items[k] << " (" << priority(x->items[k]) << ")" << std::endl;
#endif
            R->push_back(x->items[k]);
        }
        x->count = 0;
    }

    return i;
}